

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall
QPlainTextEditPrivate::repaintContents(QPlainTextEditPrivate *this,QRectF *contentsRect)

{
  QPlainTextEdit *this_00;
  int iVar1;
  long in_FS_OFFSET;
  qreal qVar2;
  undefined1 auVar3 [16];
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  QRectF local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((contentsRect->w <= 0.0) || (contentsRect->h <= 0.0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      updateViewport(this);
      return;
    }
  }
  else {
    this_00 = *(QPlainTextEdit **)
               &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                field_0x8;
    iVar1 = horizontalOffset(this);
    qVar2 = verticalOffset(this);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = contentsRect->xp + -1.0;
    dStack_80 = contentsRect->yp + -1.0;
    local_78 = contentsRect->w + 1.0 + 1.0;
    dStack_70 = contentsRect->h + 1.0 + 1.0;
    QRectF::operator&(&local_68,(QRectF *)&local_88);
    auVar3 = QRectF::toAlignedRect();
    if (auVar3._4_4_ <= auVar3._12_4_ && auVar3._0_4_ <= auVar3._8_4_) {
      local_48 = (undefined1 *)CONCAT44(auVar3._4_4_ - (int)qVar2,auVar3._0_4_ - iVar1);
      uStack_40 = (undefined1 *)CONCAT44(auVar3._12_4_ - (int)qVar2,auVar3._8_4_ - iVar1);
      QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport,(QRect *)&local_48);
      QPlainTextEdit::updateRequest(this_00,(QRect *)&local_48,0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::repaintContents(const QRectF &contentsRect)
{
    Q_Q(QPlainTextEdit);
    if (!contentsRect.isValid()) {
        updateViewport();
        return;
    }
    const int xOffset = horizontalOffset();
    const int yOffset = (int)verticalOffset();
    const QRect visibleRect(xOffset, yOffset, viewport->width(), viewport->height());

    QRect r = contentsRect.adjusted(-1, -1, 1, 1).intersected(visibleRect).toAlignedRect();
    if (r.isEmpty())
        return;

    r.translate(-xOffset, -yOffset);
    viewport->update(r);
    emit q->updateRequest(r, 0);
}